

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config_inl.hpp
# Opt level: O1

string * CLI::detail::convert_arg_for_ini
                   (string *__return_storage_ptr__,string *arg,char stringQuote,char literalQuote,
                   bool disable_multi_line)

{
  byte bVar1;
  byte *pbVar2;
  size_type sVar3;
  pointer pcVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var8;
  long *plVar9;
  size_type *psVar10;
  char *pcVar11;
  double val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (arg->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x02');
    return __return_storage_ptr__;
  }
  iVar6 = ::std::__cxx11::string::compare((char *)arg);
  if ((((iVar6 == 0) || (iVar6 = ::std::__cxx11::string::compare((char *)arg), iVar6 == 0)) ||
      (iVar6 = ::std::__cxx11::string::compare((char *)arg), iVar6 == 0)) ||
     (iVar6 = ::std::__cxx11::string::compare((char *)arg), iVar6 == 0)) goto LAB_0011f260;
  iVar6 = ::std::__cxx11::string::compare((ulong)arg,0,(char *)0x2);
  if ((iVar6 != 0) &&
     (iVar6 = ::std::__cxx11::string::compare((ulong)arg,0,(char *)0x2), iVar6 != 0)) {
    local_70._M_dataplus._M_p = (pointer)0x0;
    bVar5 = lexical_cast<double,_(CLI::detail::enabler)0>(arg,(double *)&local_70);
    if ((bVar5) &&
       (lVar7 = ::std::__cxx11::string::find_first_not_of((char *)arg,0x1b5966,0), lVar7 == -1))
    goto LAB_0011f260;
  }
  pbVar2 = (byte *)(arg->_M_dataplus)._M_p;
  sVar3 = arg->_M_string_length;
  if (sVar3 == 1) {
    iVar6 = isprint((uint)*pbVar2);
    if (iVar6 == 0) goto LAB_0011f253;
    iVar6 = ::std::__cxx11::string::compare((char *)arg);
    if (iVar6 == 0) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&local_90,'\x01');
      plVar9 = (long *)::std::__cxx11::string::append((char *)&local_90);
      psVar10 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_70.field_2._M_allocated_capacity = *psVar10;
        local_70.field_2._8_8_ = plVar9[3];
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar10;
        local_70._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_70._M_string_length = plVar9[1];
      *plVar9 = (long)psVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      ::std::operator+(__return_storage_ptr__,&local_70,stringQuote);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p == &local_90.field_2) {
        return __return_storage_ptr__;
      }
      goto LAB_0011f447;
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&local_90,'\x01');
    ::std::operator+(&local_70,&local_90,arg);
    ::std::operator+(__return_storage_ptr__,&local_70,literalQuote);
    goto LAB_0011f3cb;
  }
  if (*pbVar2 == 0x30) {
    bVar1 = pbVar2[1];
    if (bVar1 == 0x62) {
      _Var8 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_negate<CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&,char,char,bool)::_lambda(char)_3_>>
                        (pbVar2 + 2,pbVar2 + sVar3);
    }
    else if (bVar1 == 0x6f) {
      _Var8 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_negate<CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&,char,char,bool)::_lambda(char)_2_>>
                        (pbVar2 + 2,pbVar2 + sVar3);
    }
    else {
      if (bVar1 != 0x78) goto LAB_0011f23c;
      _Var8 = ::std::
              __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_negate<CLI::detail::convert_arg_for_ini(std::__cxx11::string_const&,char,char,bool)::_lambda(char)_1_>>
                        (pbVar2 + 2,pbVar2 + sVar3);
    }
    if ((byte *)_Var8._M_current == pbVar2 + sVar3) {
LAB_0011f260:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = (arg->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar4,pcVar4 + arg->_M_string_length);
      return __return_storage_ptr__;
    }
  }
LAB_0011f23c:
  pcVar4 = (arg->_M_dataplus)._M_p;
  pcVar11 = pcVar4 + arg->_M_string_length;
  _Var8 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_negate<CLI::detail::is_printable(std::__cxx11::string_const&)::_lambda(char)_1_>>
                    (pcVar4,pcVar11);
  if (_Var8._M_current != pcVar11) {
LAB_0011f253:
    binary_escape_string(__return_storage_ptr__,arg);
    return __return_storage_ptr__;
  }
  lVar7 = ::std::__cxx11::string::find_first_of((char *)arg,escapedChars_abi_cxx11_,0);
  if (lVar7 == -1) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&local_90,'\x01');
    ::std::operator+(&local_70,&local_90,arg);
    ::std::operator+(__return_storage_ptr__,&local_70,stringQuote);
LAB_0011f3cb:
    local_50.field_2._M_allocated_capacity = local_70.field_2._M_allocated_capacity;
    local_50._M_dataplus._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
LAB_0011f3de:
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (100 < arg->_M_string_length && !disable_multi_line) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"\'\'\'","");
      ::std::operator+(&local_70,&local_90,arg);
      ::std::operator+(__return_storage_ptr__,&local_70,"\'\'\'");
      goto LAB_0011f3cb;
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&local_90,'\x01');
    add_escaped_characters(&local_50,arg);
    ::std::operator+(&local_70,&local_90,&local_50);
    ::std::operator+(__return_storage_ptr__,&local_70,stringQuote);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_0011f3de;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == &local_90.field_2) {
    return __return_storage_ptr__;
  }
LAB_0011f447:
  operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string
convert_arg_for_ini(const std::string &arg, char stringQuote, char literalQuote, bool disable_multi_line) {
    if(arg.empty()) {
        return std::string(2, stringQuote);
    }
    // some specifically supported strings
    if(arg == "true" || arg == "false" || arg == "nan" || arg == "inf") {
        return arg;
    }
    // floating point conversion can convert some hex codes, but don't try that here
    if(arg.compare(0, 2, "0x") != 0 && arg.compare(0, 2, "0X") != 0) {
        using CLI::detail::lexical_cast;
        double val = 0.0;
        if(lexical_cast(arg, val)) {
            if(arg.find_first_not_of("0123456789.-+eE") == std::string::npos) {
                return arg;
            }
        }
    }
    // just quote a single non numeric character
    if(arg.size() == 1) {
        if(isprint(static_cast<unsigned char>(arg.front())) == 0) {
            return binary_escape_string(arg);
        }
        if(arg == "'") {
            return std::string(1, stringQuote) + "'" + stringQuote;
        }
        return std::string(1, literalQuote) + arg + literalQuote;
    }
    // handle hex, binary or octal arguments
    if(arg.front() == '0') {
        if(arg[1] == 'x') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) {
                   return (x >= '0' && x <= '9') || (x >= 'A' && x <= 'F') || (x >= 'a' && x <= 'f');
               })) {
                return arg;
            }
        } else if(arg[1] == 'o') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) { return (x >= '0' && x <= '7'); })) {
                return arg;
            }
        } else if(arg[1] == 'b') {
            if(std::all_of(arg.begin() + 2, arg.end(), [](char x) { return (x == '0' || x == '1'); })) {
                return arg;
            }
        }
    }
    if(!is_printable(arg)) {
        return binary_escape_string(arg);
    }
    if(detail::has_escapable_character(arg)) {
        if(arg.size() > 100 && !disable_multi_line) {
            return std::string(multiline_literal_quote) + arg + multiline_literal_quote;
        }
        return std::string(1, stringQuote) + detail::add_escaped_characters(arg) + stringQuote;
    }
    return std::string(1, stringQuote) + arg + stringQuote;
}